

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O3

bool CoreML::Specification::operator==(ModelDescription *a,ModelDescription *b)

{
  string *psVar1;
  string *psVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  Metadata *b_00;
  Metadata *a_00;
  
  bVar4 = operator==(&a->input_,&b->input_);
  if ((bVar4) && (bVar4 = operator==(&a->output_,&b->output_), bVar4)) {
    psVar1 = (a->predictedfeaturename_).ptr_;
    psVar2 = (b->predictedfeaturename_).ptr_;
    sVar3 = psVar1->_M_string_length;
    if (sVar3 == psVar2->_M_string_length) {
      if ((sVar3 != 0) &&
         (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar5 != 0)) {
        return false;
      }
      psVar1 = (a->predictedprobabilitiesname_).ptr_;
      psVar2 = (b->predictedprobabilitiesname_).ptr_;
      sVar3 = psVar1->_M_string_length;
      if (sVar3 == psVar2->_M_string_length) {
        if ((sVar3 != 0) &&
           (iVar5 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar5 != 0))
        {
          return false;
        }
        a_00 = a->metadata_;
        if (a_00 == (Metadata *)0x0) {
          a_00 = (Metadata *)&_Metadata_default_instance_;
        }
        b_00 = b->metadata_;
        if (b_00 == (Metadata *)0x0) {
          b_00 = (Metadata *)&_Metadata_default_instance_;
        }
        bVar4 = operator==(a_00,b_00);
        return bVar4;
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const ModelDescription& a,
                        const ModelDescription& b) {
            if (a.input() != b.input()) {
                return false;
            }
            if (a.output() != b.output()) {
                return false;
            }
            if (a.predictedfeaturename() != b.predictedfeaturename()) {
                return false;
            }
            if (a.predictedprobabilitiesname() != b.predictedprobabilitiesname()) {
                return false;
            }
            if (a.metadata() != b.metadata()) {
                return false;
            }
            return true;
        }